

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int * __thiscall
kj::_::NullableValue<int>::emplace<long_long>(NullableValue<int> *this,longlong *params)

{
  longlong *params_00;
  longlong *params_local;
  NullableValue<int> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<int>(&(this->field_1).value);
  }
  params_00 = fwd<long_long>(params);
  ctor<int,long_long>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (int *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }